

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::all_in_same_bucket
          (dht *this,span<const_libtorrent::dht::node_entry> b,node_id *id,int bucket_index)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  node_entry *pnVar4;
  bool local_65;
  int idx;
  node_entry *e;
  node_entry *__end2;
  node_entry *__begin2;
  span<const_libtorrent::dht::node_entry> *__range2;
  int local_38;
  int i;
  int counter [2];
  uint8_t mask;
  int bit_offset;
  int byte_offset;
  int bucket_index_local;
  node_id *id_local;
  span<const_libtorrent::dht::node_entry> b_local;
  
  b_local.m_ptr = b.m_ptr;
  iVar1 = (int)id / 8;
  counter[1] = (int)id % 8;
  counter[0]._3_1_ = (byte)(0x80 >> ((byte)counter[1] & 0x1f));
  id_local = (node_id *)this;
  memset(&local_38,0,8);
  pbVar3 = digest32<160L>::operator[]((digest32<160L> *)b.m_len,(long)iVar1);
  uVar2 = (uint)((*pbVar3 & counter[0]._3_1_) != 0);
  (&local_38)[(int)uVar2] = (&local_38)[(int)uVar2] + 1;
  __end2 = span<const_libtorrent::dht::node_entry>::begin
                     ((span<const_libtorrent::dht::node_entry> *)&id_local);
  pnVar4 = span<const_libtorrent::dht::node_entry>::end
                     ((span<const_libtorrent::dht::node_entry> *)&id_local);
  for (; __end2 != pnVar4; __end2 = __end2 + 1) {
    pbVar3 = digest32<160L>::operator[](&__end2->id,(long)iVar1);
    uVar2 = (uint)((*pbVar3 & counter[0]._3_1_) != 0);
    (&local_38)[(int)uVar2] = (&local_38)[(int)uVar2] + 1;
  }
  local_65 = local_38 == 0 || i == 0;
  return local_65;
}

Assistant:

bool all_in_same_bucket(span<node_entry const> b, node_id const& id, int const bucket_index)
{
	int const byte_offset = bucket_index / 8;
	int const bit_offset = bucket_index % 8;
	std::uint8_t const mask = 0x80 >> bit_offset;
	int counter[2] = {0, 0};
	int const i =  (id[byte_offset] & mask) ? 1 : 0;
	++counter[i];
	for (auto const& e : b)
	{
		int const idx =  (e.id[byte_offset] & mask) ? 1 : 0;
		++counter[idx];
	}
	return counter[0] == 0 || counter[1] == 0;
}